

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O1

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  char *pcVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  mode_t mVar5;
  la_int64_t v;
  char *pcVar6;
  size_t sVar7;
  time_t v_00;
  la_int64_t lVar8;
  char *__s;
  char *pcVar9;
  int s;
  char buff [60];
  undefined8 local_78;
  undefined8 uStack_70;
  char local_68 [56];
  
  plVar2 = (long *)a->format_data;
  *(undefined4 *)(plVar2 + 2) = 0;
  v = archive_entry_size(entry);
  pcVar6 = archive_entry_pathname(entry);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
LAB_00463783:
    pcVar6 = "Invalid filename";
    goto LAB_0046378a;
  }
  if ((char)plVar2[3] == '\0') {
    __archive_write_output(a,"!<arch>\n",8);
    *(undefined1 *)(plVar2 + 3) = 1;
  }
  builtin_strncpy(local_68,"                                          `\n",0x2c);
  local_78 = 0x2020202020202020;
  uStack_70 = 0x2020202020202020;
  iVar4 = strcmp(pcVar6,"/");
  if (iVar4 == 0) {
    local_78 = CONCAT71(local_78._1_7_,0x2f);
LAB_00463673:
    bVar3 = false;
    __s = (char *)0x0;
LAB_00463679:
    v_00 = archive_entry_mtime(entry);
    iVar4 = format_decimal(v_00,local_68,0xc);
    if (iVar4 == 0) {
      lVar8 = archive_entry_uid(entry);
      iVar4 = format_decimal(lVar8,local_68 + 0xc,6);
      if (iVar4 == 0) {
        lVar8 = archive_entry_gid(entry);
        iVar4 = format_decimal(lVar8,local_68 + 0x12,6);
        if (iVar4 == 0) {
          mVar5 = archive_entry_mode(entry);
          iVar4 = format_octal((ulong)mVar5,local_68 + 0x18,s);
          if (iVar4 == 0) {
            if (__s == (char *)0x0) goto LAB_004636e3;
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 != 0x8000) {
              pcVar6 = "Regular file required for non-pseudo member";
              goto LAB_0046378a;
            }
            goto LAB_004636e6;
          }
          pcVar6 = "Numeric mode too large";
        }
        else {
          pcVar6 = "Numeric group ID too large";
        }
      }
      else {
        pcVar6 = "Numeric user ID too large";
      }
    }
    else {
      pcVar6 = "File modification time too large";
    }
  }
  else {
    iVar4 = strcmp(pcVar6,"__.SYMDEF");
    if (iVar4 == 0) {
      local_78 = 0x45444d59532e5f5f;
      uStack_70 = CONCAT71(uStack_70._1_7_,0x46);
      goto LAB_00463673;
    }
    iVar4 = strcmp(pcVar6,"//");
    if (iVar4 == 0) {
      *(undefined4 *)(plVar2 + 2) = 1;
      local_78 = CONCAT62(local_78._2_6_,0x2f2f);
      bVar3 = false;
LAB_004636e3:
      __s = (char *)0x0;
LAB_004636e6:
      iVar4 = format_decimal(v,local_68 + 0x20,10);
      if (iVar4 == 0) {
        iVar4 = __archive_write_output(a,&local_78,0x3c);
        if (iVar4 != 0) {
          return iVar4;
        }
        *plVar2 = v;
        plVar2[1] = (ulong)((uint)v & 1);
        if (!bVar3) {
          return 0;
        }
        sVar7 = strlen(__s);
        iVar4 = __archive_write_output(a,__s,sVar7);
        if (iVar4 != 0) {
          return iVar4;
        }
        sVar7 = strlen(__s);
        *plVar2 = *plVar2 - sVar7;
        return 0;
      }
      pcVar6 = "File size out of range";
    }
    else {
      sVar7 = strlen(pcVar6);
      if (pcVar6[sVar7 - 1] == '/') {
        __s = (char *)0x0;
      }
      else {
        pcVar9 = pcVar6 + sVar7;
        do {
          __s = pcVar9 + -1;
          if (__s <= pcVar6) break;
          pcVar1 = pcVar9 + -2;
          pcVar9 = __s;
        } while (*pcVar1 != '/');
      }
      if (__s == (char *)0x0) goto LAB_00463783;
      iVar4 = (a->archive).archive_format;
      bVar3 = false;
      if (iVar4 != 0x70002) {
        if (iVar4 != 0x70001) goto LAB_00463679;
        sVar7 = strlen(__s);
        if (sVar7 < 0x10) {
          strncpy((char *)&local_78,__s,sVar7);
          sVar7 = strlen(__s);
          *(undefined1 *)((long)&local_78 + sVar7) = 0x2f;
          goto LAB_00463679;
        }
        if (*(int *)((long)plVar2 + 0x14) < 1) {
          pcVar6 = "Can\'t find string table";
        }
        else {
          pcVar6 = (char *)malloc(sVar7 + 3);
          if (pcVar6 == (char *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate filename buffer");
            return -0x1e;
          }
          strncpy(pcVar6,__s,sVar7);
          sVar7 = strlen(__s);
          (pcVar6 + sVar7)[0] = '/';
          (pcVar6 + sVar7)[1] = '\n';
          pcVar6[sVar7 + 2] = '\0';
          pcVar9 = strstr((char *)plVar2[4],pcVar6);
          free(pcVar6);
          if (pcVar9 != (char *)0x0) {
            local_78 = CONCAT71(local_78._1_7_,0x2f);
            iVar4 = format_decimal((long)pcVar9 - plVar2[4],(char *)((long)&local_78 + 1),0xf);
            bVar3 = false;
            if (iVar4 != 0) {
              pcVar6 = "string table offset too large";
              goto LAB_00463871;
            }
            goto LAB_00463679;
          }
          pcVar6 = "Invalid string table";
        }
LAB_0046378a:
        iVar4 = 0x16;
        goto LAB_00463879;
      }
      sVar7 = strlen(__s);
      if ((sVar7 < 0x11) && (pcVar6 = strchr(__s,0x20), pcVar6 == (char *)0x0)) {
        strncpy((char *)&local_78,__s,sVar7);
        sVar7 = strlen(__s);
        *(undefined1 *)((long)&local_78 + sVar7) = 0x20;
        goto LAB_00463679;
      }
      local_78 = CONCAT53(local_78._3_5_,0x2f0000);
      local_78 = CONCAT62(local_78._2_6_,0x3123);
      sVar7 = strlen(__s);
      iVar4 = format_decimal(sVar7,(char *)((long)&local_78 + 3),0xd);
      if (iVar4 == 0) {
        sVar7 = strlen(__s);
        v = v + sVar7;
        bVar3 = true;
        goto LAB_00463679;
      }
      pcVar6 = "File name too long";
    }
  }
LAB_00463871:
  iVar4 = 0x22;
LAB_00463879:
  archive_set_error(&a->archive,iVar4,pcVar6);
  return -0x14;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	strncpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		strncpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			strncpy(&buff[AR_name_offset], 
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			strncpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			strncpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			strncpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}